

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

int myrand(void *rng_state,uchar *output,size_t len)

{
  int iVar1;
  size_t sVar2;
  
  if (len != 0) {
    sVar2 = 0;
    do {
      iVar1 = rand();
      output[sVar2] = (uchar)iVar1;
      sVar2 = sVar2 + 1;
    } while (len != sVar2);
  }
  return 0;
}

Assistant:

static int myrand( void *rng_state, unsigned char *output, size_t len )
{
#if !defined(__OpenBSD__)
    size_t i;

    if( rng_state != NULL )
        rng_state  = NULL;

    for( i = 0; i < len; ++i )
        output[i] = rand();
#else
    if( rng_state != NULL )
        rng_state = NULL;

    arc4random_buf( output, len );
#endif /* !OpenBSD */

    return( 0 );
}